

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void Js::DynamicTypeHandler::SetSlotUnchecked(DynamicObject *instance,int index,Var value)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  int iVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 *puVar7;
  WriteBarrierPtr<void> **ppWVar8;
  Type *slots;
  int slotCapacity;
  uint16 offsetOfInlineSlots;
  uint16 inlineSlotCapacity;
  Var value_local;
  int index_local;
  DynamicObject *instance_local;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (((!bVar2) && (bVar2 = ThreadContext::IsOnStack(value), bVar2)) &&
     (bVar2 = TaggedNumber::Is(value), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x87,
                                "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                ,
                                "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  uVar3 = GetInlineSlotCapacity(pDVar6);
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  uVar4 = GetOffsetOfInlineSlots(pDVar6);
  pDVar6 = DynamicObject::GetTypeHandler(instance);
  iVar5 = GetSlotCapacity(pDVar6);
  if (index < (int)(uint)uVar3) {
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)
               ((long)&(&(instance->super_RecyclableObject).super_FinalizableObject)[index].
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar4),
               value);
  }
  else {
    if ((int)(iVar5 - (uint)uVar3) <= (int)(index - (uint)uVar3)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x93,
                                  "((index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity))"
                                  ,
                                  "(index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&instance->auxSlots);
    Memory::WriteBarrierPtr<void>::operator=(*ppWVar8 + (int)(index - (uint)uVar3),value);
  }
  return;
}

Assistant:

void DynamicTypeHandler::SetSlotUnchecked(DynamicObject * instance, int index, Var value)
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        uint16 inlineSlotCapacity = instance->GetTypeHandler()->GetInlineSlotCapacity();
        uint16 offsetOfInlineSlots = instance->GetTypeHandler()->GetOffsetOfInlineSlots();
        int slotCapacity = instance->GetTypeHandler()->GetSlotCapacity();

        if (index < inlineSlotCapacity)
        {
            Field(Var) * slots = reinterpret_cast<Field(Var)*>(reinterpret_cast<size_t>(instance) + offsetOfInlineSlots);
            slots[index] = value;
        }
        else
        {
            Assert((index - inlineSlotCapacity) < (slotCapacity - inlineSlotCapacity));
            instance->auxSlots[index - inlineSlotCapacity] = value;
        }
    }